

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

bool __thiscall QPDF::resolveXRefTable(QPDF *this)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  QPDFObjGen og;
  QPDFObjGen og_00;
  bool bVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var5 = *(_Base_ptr *)((long)&(_Var3._M_head_impl)->xref_table + 0x18);
  p_Var1 = (_Base_ptr)((long)&(_Var3._M_head_impl)->xref_table + 8);
  bVar6 = p_Var5 == p_Var1;
  if (!bVar6) {
    bVar2 = (_Var3._M_head_impl)->reconstructed_xref;
    do {
      og.obj = p_Var5[1]._M_color;
      og.gen = *(int *)&p_Var5[1].field_0x4;
      bVar4 = isUnresolved(this,og);
      if (((bVar4) &&
          (og_00.obj = p_Var5[1]._M_color, og_00.gen = *(int *)&p_Var5[1].field_0x4,
          resolve(this,og_00), bVar2 == false)) &&
         (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->reconstructed_xref != false)
         ) {
        return bVar6;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      bVar6 = p_Var5 == p_Var1;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

void
QPDF::setTrailer(QPDFObjectHandle obj)
{
    if (m->trailer) {
        return;
    }
    m->trailer = obj;
}